

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlTablePass.h
# Opt level: O1

void __thiscall GdlPass::GdlPass(GdlPass *this,int nNum,int nMaxRuleLoop,int nMaxBackup)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long lVar3;
  
  GdlObject::GdlObject(&this->super_GdlObject);
  this->m_nNumber = nNum;
  this->m_nMaxRuleLoop = nMaxRuleLoop;
  this->m_nMaxBackup = nMaxBackup;
  (this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vpexpConstraints).super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vpexpConstraints).super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vpexpConstraints).super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_vpexpConstraints).
           super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 5) = 0;
  this->m_nCollisionThreshold = 0;
  this->m_nDir = 0;
  this->m_fFlipDir = false;
  this->m_nGlobalID = -1;
  this->m_nPreBidiPass = 0;
  this->m_pfsm = (FsmTable *)0x0;
  p_Var1 = &(this->m_hmGlyphToColumn)._M_t._M_impl.super__Rb_tree_header;
  (this->m_hmGlyphToColumn)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_hmGlyphToColumn)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_hmGlyphToColumn)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_hmGlyphToColumn)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_hmGlyphToColumn)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_vpfsmc).super__Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vpfsmc).super__Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vpfsmc).super__Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = 0;
  do {
    lVar2 = (long)&this->m_rgscsInclusions[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_color
            + lVar3;
    *(undefined4 *)
     ((long)&this->m_rgscsInclusions[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
     lVar3) = 0;
    *(undefined8 *)
     ((long)&this->m_rgscsInclusions[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
     lVar3) = 0;
    *(long *)((long)&this->m_rgscsInclusions[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left
             + lVar3) = lVar2;
    *(long *)((long)&this->m_rgscsInclusions[0]._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_right + lVar3) = lVar2;
    *(undefined8 *)
     ((long)&this->m_rgscsInclusions[0]._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar3) =
         0;
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0x2fffd0);
  p_Var1 = &(this->m_hmMachineClassMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_hmMachineClassMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_hmMachineClassMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_hmMachineClassMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_hmMachineClassMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_hmMachineClassMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_vifsWorkToFinal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vifsWorkToFinal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vifsWorkToFinal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vifsFinalToWork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vifsFinalToWork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vifsFinalToWork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vrowStartStates).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vrowStartStates).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vrowStartStates).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

GdlPass(int nNum, int nMaxRuleLoop, int nMaxBackup)
		:	m_nNumber(nNum),
			m_nMaxRuleLoop(nMaxRuleLoop),
			m_nMaxBackup(nMaxBackup),
			m_nCollisionFix(0),
			m_nAutoKern(false),
			m_nCollisionThreshold(0),
			m_nDir(0),
			m_fFlipDir(0),
			m_nGlobalID(-1),
			m_nPreBidiPass(0),
			m_pfsm(NULL)
	{
	}